

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

int __thiscall
S2Builder::EdgeChainSimplifier::input_edge_layer(EdgeChainSimplifier *this,InputEdgeId id)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  S2LogMessage SStack_18;
  
  if (-1 < id) {
    piVar1 = (this->layer_begins_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = piVar1;
    uVar5 = (long)(this->layer_begins_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar1 >> 2;
    while (piVar2 = piVar3, 0 < (long)uVar5) {
      uVar4 = uVar5 >> 1;
      uVar5 = ~uVar4 + uVar5;
      piVar3 = piVar2 + uVar4 + 1;
      if (id < piVar2[uVar4]) {
        piVar3 = piVar2;
        uVar5 = uVar4;
      }
    }
    return (int)((ulong)((long)piVar2 + (-4 - (long)piVar1)) >> 2);
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builder.cc"
             ,0x5a8,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_18.stream_,"Check failed: (id) >= (0) ",0x1a);
  abort();
}

Assistant:

int S2Builder::EdgeChainSimplifier::input_edge_layer(InputEdgeId id) const {
  // NOTE(ericv): If this method shows up in profiling, the result could be
  // stored with each edge (i.e., edge_layers_ and new_edge_layers_).
  S2_DCHECK_GE(id, 0);
  return (std::upper_bound(layer_begins_.begin(), layer_begins_.end(), id) -
          (layer_begins_.begin() + 1));
}